

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

CalculatedFloat
absl::lts_20250127::anon_unknown_0::CalculateFromParsedDecimal<double>(ParsedFloat *parsed_decimal)

{
  uint128 value;
  bool bVar1;
  int iVar2;
  uint64_t v;
  Nonnull<bool_*> in_R9;
  uint128 value_00;
  CalculatedFloat CVar3;
  uint64_t local_88;
  uint64_t binary_mantissa;
  bool result_exact;
  anon_unknown_0 *paStack_78;
  int shift;
  uint64_t local_70;
  int local_64;
  byte local_5d;
  int mantissa_width;
  undefined1 auStack_58 [3];
  bool mantissa_exact;
  int binary_exponent;
  undefined1 local_48 [8];
  uint128 wide_binary_mantissa;
  undefined1 local_30 [8];
  CalculatedFloat result;
  ParsedFloat *parsed_decimal_local;
  int local_10;
  
  result._8_8_ = parsed_decimal;
  CalculatedFloat::CalculatedFloat((CalculatedFloat *)local_30);
  bVar1 = Power10Underflow(*(int *)(result._8_8_ + 8));
  if (bVar1) {
    parsed_decimal_local = (ParsedFloat *)local_30;
    local_10 = -99999;
  }
  else {
    bVar1 = Power10Overflow(*(int *)(result._8_8_ + 8));
    if (bVar1) {
      parsed_decimal_local = (ParsedFloat *)local_30;
      local_10 = 99999;
    }
    else {
      uint128::uint128((uint128 *)local_48,*(unsigned_long *)result._8_8_);
      v = Power10Mantissa(*(int *)(result._8_8_ + 8));
      uint128::uint128((uint128 *)auStack_58,v);
      uint128::operator*=((uint128 *)local_48,_auStack_58);
      mantissa_width = Power10Exponent(*(int *)(result._8_8_ + 8));
      if (*(long *)(result._8_8_ + 0x18) == 0) {
        bVar1 = Power10Exact(*(int *)(result._8_8_ + 8));
        if (bVar1) {
          paStack_78 = (anon_unknown_0 *)local_48;
          local_70 = wide_binary_mantissa.lo_;
          value.hi_ = wide_binary_mantissa.lo_;
          value.lo_ = (uint64_t)local_48;
          local_64 = BitWidth(value);
          local_5d = 1;
        }
        else {
          local_64 = 0x3f;
          local_5d = 0;
          iVar2 = TruncateToBitWidth(0x3f,(Nonnull<uint128_*>)local_48);
          mantissa_width = iVar2 + mantissa_width;
        }
      }
      else {
        local_64 = 0x3a;
        local_5d = 0;
        iVar2 = TruncateToBitWidth(0x3a,(Nonnull<uint128_*>)local_48);
        mantissa_width = iVar2 + mantissa_width;
      }
      binary_mantissa._4_4_ = NormalizedShiftSize<double>(local_64,mantissa_width);
      mantissa_width = binary_mantissa._4_4_ + mantissa_width;
      value_00.hi_._0_4_ = binary_mantissa._4_4_;
      value_00.lo_ = wide_binary_mantissa.lo_;
      value_00.hi_._4_4_ = 0;
      local_88 = ShiftRightAndRound((anon_unknown_0 *)local_48,value_00,(uint)(local_5d & 1),
                                    (bool)((char)&binary_mantissa + '\x03'),in_R9);
      if (((binary_mantissa._3_1_ & 1) == 0) &&
         (bVar1 = MustRoundUp(local_88,mantissa_width,(ParsedFloat *)result._8_8_), bVar1)) {
        local_88 = local_88 + 1;
      }
      CVar3 = CalculatedFloatFromRawValues<double>(local_88,mantissa_width);
      parsed_decimal_local = (ParsedFloat *)CVar3.mantissa;
      local_10 = CVar3.exponent;
    }
  }
  CVar3.exponent = local_10;
  CVar3.mantissa = (uint64_t)parsed_decimal_local;
  CVar3._12_4_ = 0;
  return CVar3;
}

Assistant:

CalculatedFloat CalculateFromParsedDecimal(
    const strings_internal::ParsedFloat& parsed_decimal) {
  CalculatedFloat result;

  // Large or small enough decimal exponents will always result in overflow
  // or underflow.
  if (Power10Underflow(parsed_decimal.exponent)) {
    result.exponent = kUnderflow;
    return result;
  } else if (Power10Overflow(parsed_decimal.exponent)) {
    result.exponent = kOverflow;
    return result;
  }

  // Otherwise convert our power of 10 into a power of 2 times an integer
  // mantissa, and multiply this by our parsed decimal mantissa.
  uint128 wide_binary_mantissa = parsed_decimal.mantissa;
  wide_binary_mantissa *= Power10Mantissa(parsed_decimal.exponent);
  int binary_exponent = Power10Exponent(parsed_decimal.exponent);

  // Discard bits that are inaccurate due to truncation error.  The magic
  // `mantissa_width` constants below are justified in
  // https://abseil.io/about/design/charconv. They represent the number of bits
  // in `wide_binary_mantissa` that are guaranteed to be unaffected by error
  // propagation.
  bool mantissa_exact;
  int mantissa_width;
  if (parsed_decimal.subrange_begin) {
    // Truncated mantissa
    mantissa_width = 58;
    mantissa_exact = false;
    binary_exponent +=
        TruncateToBitWidth(mantissa_width, &wide_binary_mantissa);
  } else if (!Power10Exact(parsed_decimal.exponent)) {
    // Exact mantissa, truncated power of ten
    mantissa_width = 63;
    mantissa_exact = false;
    binary_exponent +=
        TruncateToBitWidth(mantissa_width, &wide_binary_mantissa);
  } else {
    // Product is exact
    mantissa_width = BitWidth(wide_binary_mantissa);
    mantissa_exact = true;
  }

  // Shift into an FloatType-sized mantissa, and round to nearest.
  const int shift =
      NormalizedShiftSize<FloatType>(mantissa_width, binary_exponent);
  bool result_exact;
  binary_exponent += shift;
  uint64_t binary_mantissa = ShiftRightAndRound(wide_binary_mantissa, shift,
                                                mantissa_exact, &result_exact);
  if (!result_exact) {
    // We could not determine the rounding direction using int128 math.  Use
    // full resolution math instead.
    if (MustRoundUp(binary_mantissa, binary_exponent, parsed_decimal)) {
      binary_mantissa += 1;
    }
  }

  return CalculatedFloatFromRawValues<FloatType>(binary_mantissa,
                                                 binary_exponent);
}